

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O2

void __thiscall OpenMD::DirectionalAtom::DirectionalAtom(DirectionalAtom *this,AtomType *dAtomType)

{
  bool bVar1;
  int i;
  long lVar2;
  int iVar3;
  double *pdVar4;
  MultipoleAdapter ma;
  DirectionalAdapter da;
  Mat3x3d inertiaTensor;
  
  Atom::Atom(&this->super_Atom,dAtomType);
  (this->super_Atom).super_StuntDouble._vptr_StuntDouble =
       (_func_int **)&PTR__DirectionalAtom_002bf748;
  SquareMatrix<double,_3>::SquareMatrix(&(this->I_).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->dipole_).super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->quadrupole_).super_SquareMatrix<double,_3>);
  (this->super_Atom).super_StuntDouble.objType_ = otDAtom;
  da.at_ = dAtomType;
  DirectionalAdapter::getI(&inertiaTensor,&da);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->I_,(RectMatrix<double,_3U,_3U> *)&inertiaTensor);
  ma.at_ = dAtomType;
  bVar1 = MultipoleAdapter::isDipole(&ma);
  if (bVar1) {
    MultipoleAdapter::getDipole((Vector3d *)&inertiaTensor,&ma);
    Vector<double,_3U>::operator=
              (&(this->dipole_).super_Vector<double,_3U>,(Vector<double,_3U> *)&inertiaTensor);
  }
  bVar1 = MultipoleAdapter::isQuadrupole(&ma);
  if (bVar1) {
    MultipoleAdapter::getQuadrupole(&inertiaTensor,&ma);
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)&this->quadrupole_,
               (RectMatrix<double,_3U,_3U> *)&inertiaTensor);
  }
  pdVar4 = (double *)&inertiaTensor;
  (*(this->super_Atom).super_StuntDouble._vptr_StuntDouble[5])(pdVar4,this);
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    if (ABS(*pdVar4) < 1e-06) {
      (this->super_Atom).super_StuntDouble.linear_ = true;
      (this->super_Atom).super_StuntDouble.linearAxis_ = (int)lVar2;
      iVar3 = iVar3 + 1;
    }
    pdVar4 = pdVar4 + 4;
  }
  if (1 < iVar3) {
    memcpy(&painCave,
           "Directional Atom warning.\n\tOpenMD found more than one axis in this directional atom with a vanishing \n\tmoment of inertia."
           ,0x7a);
    painCave.isFatal = 0;
    simError();
  }
  return;
}

Assistant:

DirectionalAtom::DirectionalAtom(AtomType* dAtomType) : Atom(dAtomType) {
    objType_ = otDAtom;

    DirectionalAdapter da = DirectionalAdapter(dAtomType);
    I_                    = da.getI();

    MultipoleAdapter ma = MultipoleAdapter(dAtomType);
    if (ma.isDipole()) { dipole_ = ma.getDipole(); }
    if (ma.isQuadrupole()) { quadrupole_ = ma.getQuadrupole(); }

    // Check if one of the diagonal inertia tensor of this directional
    // atom is zero:
    int nLinearAxis       = 0;
    Mat3x3d inertiaTensor = getI();
    for (int i = 0; i < 3; i++) {
      if (fabs(inertiaTensor(i, i)) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Directional Atom warning.\n"
          "\tOpenMD found more than one axis in this directional atom with a "
          "vanishing \n"
          "\tmoment of inertia.");
      painCave.isFatal = 0;
      simError();
    }
  }